

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::RenderPassVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderPassVkImpl> *this,RenderPassVkImpl *pObj)

{
  RenderPassVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (RenderPassVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      ::Release((DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (RenderPassVkImpl *)0x0) {
      RefCountedObject<Diligent::IRenderPassVk>::AddRef
                ((RefCountedObject<Diligent::IRenderPassVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }